

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::DataManWriter::PushBufferQueue
          (DataManWriter *this,shared_ptr<std::vector<char,_std::allocator<char>_>_> *buffer)

{
  std::mutex::lock(&this->m_BufferQueueMutex);
  std::
  deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
  ::push_back(&(this->m_BufferQueue).c,buffer);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_BufferQueueMutex);
  return;
}

Assistant:

void DataManWriter::PushBufferQueue(std::shared_ptr<std::vector<char>> buffer)
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    m_BufferQueue.push(buffer);
}